

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O3

int __thiscall glslang::TPpContext::CPPifdef(TPpContext *this,int defined,TPpToken *ppToken)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  _Base_ptr p_Var5;
  char *pcVar6;
  _Base_ptr p_Var7;
  _Base_ptr *pp_Var8;
  
  iVar2 = scanToken(this,ppToken);
  if ((0x41 < this->ifdepth) || (0x41 < this->elsetracker)) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"maximum nesting depth exceeded","#ifdef","");
    return -1;
  }
  this->elsetracker = this->elsetracker + 1;
  this->ifdepth = this->ifdepth + 1;
  if (iVar2 != 0xa2) {
    if (defined == 0) {
      pcVar6 = "#ifndef";
    }
    else {
      pcVar6 = "#ifdef";
    }
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,"must be followed by macro name",pcVar6,"");
    return iVar2;
  }
  iVar2 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
  p_Var7 = (this->macroDefs).
           super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->macroDefs).
              super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (iVar2 <= (int)p_Var7[1]._M_color) {
        p_Var5 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < iVar2];
    } while (p_Var7 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      pp_Var8 = (_Base_ptr *)0x0;
      if ((int)p_Var5[1]._M_color <= iVar2) {
        pp_Var8 = &p_Var5[1]._M_parent;
      }
      goto LAB_0044169c;
    }
  }
  pp_Var8 = (_Base_ptr *)0x0;
LAB_0044169c:
  iVar3 = scanToken(this,ppToken);
  iVar2 = 10;
  if (iVar3 != 10) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,ppToken,
               "unexpected tokens following #ifdef directive - expected a newline","#ifdef","");
    iVar2 = iVar3;
    while ((iVar2 != -1 && (iVar2 != 10))) {
      iVar2 = scanToken(this,ppToken);
    }
  }
  uVar4 = 0;
  if (pp_Var8 != (_Base_ptr *)0x0) {
    uVar4 = (uint)((*(byte *)(pp_Var8 + 9) & 4) == 0);
  }
  if (uVar4 == defined) {
    return iVar2;
  }
  iVar2 = CPPelse(this,1,ppToken);
  return iVar2;
}

Assistant:

int TPpContext::CPPifdef(int defined, TPpToken* ppToken)
{
    int token = scanToken(ppToken);
    if (ifdepth > maxIfNesting || elsetracker > maxIfNesting) {
        parseContext.ppError(ppToken->loc, "maximum nesting depth exceeded", "#ifdef", "");
        return EndOfInput;
    } else {
        elsetracker++;
        ifdepth++;
    }

    if (token != PpAtomIdentifier) {
        if (defined)
            parseContext.ppError(ppToken->loc, "must be followed by macro name", "#ifdef", "");
        else
            parseContext.ppError(ppToken->loc, "must be followed by macro name", "#ifndef", "");
    } else {
        MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
        token = scanToken(ppToken);
        if (token != '\n') {
            parseContext.ppError(ppToken->loc, "unexpected tokens following #ifdef directive - expected a newline", "#ifdef", "");
            while (token != '\n' && token != EndOfInput)
                token = scanToken(ppToken);
        }
        if (((macro != nullptr && !macro->undef) ? 1 : 0) != defined)
            token = CPPelse(1, ppToken);
    }

    return token;
}